

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O2

void __thiscall BufferedReader::deleteReader(BufferedReader *this,int readerID)

{
  _Base_ptr p_Var1;
  iterator __position;
  key_type_conflict local_24;
  
  std::mutex::lock(&this->m_readersMtx);
  __position = std::
               _Rb_tree<int,_std::pair<const_int,_ReaderData_*>,_std::_Select1st<std::pair<const_int,_ReaderData_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
               ::find(&(this->m_readers)._M_t,&local_24);
  if ((_Rb_tree_header *)__position._M_node != &(this->m_readers)._M_t._M_impl.super__Rb_tree_header
     ) {
    p_Var1 = __position._M_node[1]._M_parent;
    if (*(int *)((long)&p_Var1->_M_left + 4) < 1) {
      (**(code **)(*(long *)p_Var1 + 8))();
      std::
      _Rb_tree<int,std::pair<int_const,ReaderData*>,std::_Select1st<std::pair<int_const,ReaderData*>>,std::less<int>,std::allocator<std::pair<int_const,ReaderData*>>>
      ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,ReaderData*>,std::_Select1st<std::pair<int_const,ReaderData*>>,std::less<int>,std::allocator<std::pair<int_const,ReaderData*>>>
                          *)&this->m_readers,__position);
    }
    else {
      *(undefined1 *)&p_Var1->_M_left = 1;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_readersMtx);
  return;
}

Assistant:

void BufferedReader::deleteReader(const int readerID)
{
    {
        std::lock_guard lock(m_readersMtx);
        const auto iterator = m_readers.find(readerID);
        if (iterator == m_readers.end())
            return;
        ReaderData* data = iterator->second;
        if (data->m_atQueue > 0)
            data->m_deleted = true;  // There are requests in the queue for reading into this structure.
        else
        {
            delete iterator->second;  // No outstanding requests for reading in the queue. Delete immediately.
            m_readers.erase(iterator);
        }
    }
}